

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

void __thiscall pstore::database::finish_init(database *this,bool access_tick_enabled)

{
  uint uVar1;
  file_base *pfVar2;
  uint64_t absolute;
  database *this_00;
  header *header;
  unique_lock<pstore::file::range_lock> local_98;
  range_lock local_88;
  string local_68;
  address local_48;
  undefined1 local_40 [55];
  bool access_tick_enabled_local;
  database *this_local;
  
  local_40[0x2f] = access_tick_enabled;
  unique0x100002d1 = this;
  pfVar2 = file(this);
  uVar1 = (*pfVar2->_vptr_file_base[2])();
  if ((uVar1 & 1) == 0) {
    assert_failed("file ()->is_open ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/database.cpp"
                  ,0x46);
  }
  pstore::storage::update_master_pointers(&this->storage_,0);
  local_40._32_8_ = sizes::footer_pos(&this->size_);
  trailer::validate(this,(typed_address<pstore::trailer>)local_40._32_8_);
  address::address((address *)(local_40 + 0x18),0x30);
  absolute = sizes::logical_size(&this->size_);
  address::address((address *)(local_40 + 0x10),absolute);
  protect(this,(address)local_40._24_8_,(address)local_40._16_8_);
  local_48.a_ = (value_type)typed_address<pstore::header>::null();
  pstore::storage::address_to_pointer<pstore::header>
            ((storage *)local_40,(typed_address<pstore::header>)&this->storage_);
  std::shared_ptr<pstore::header>::operator=(&this->header_,(shared_ptr<pstore::header> *)local_40);
  std::shared_ptr<pstore::header>::~shared_ptr((shared_ptr<pstore::header> *)local_40);
  this_00 = (database *)
            std::__shared_ptr_access<pstore::header,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*((__shared_ptr_access<pstore::header,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->header_);
  build_sync_name_abi_cxx11_(&local_68,this_00,header);
  std::__cxx11::string::operator=((string *)&this->sync_name_,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  pfVar2 = file(this);
  anon_unknown.dwarf_366cf4::get_vacuum_range_lock(&local_88,pfVar2,shared_read);
  pstore::file::range_lock::operator=(&this->range_lock_,&local_88);
  pstore::file::range_lock::~range_lock(&local_88);
  std::unique_lock<pstore::file::range_lock>::unique_lock(&local_98,&this->range_lock_);
  std::unique_lock<pstore::file::range_lock>::operator=(&this->lock_,&local_98);
  std::unique_lock<pstore::file::range_lock>::~unique_lock(&local_98);
  return;
}

Assistant:

void database::finish_init (bool const access_tick_enabled) {
        (void) access_tick_enabled;

        PSTORE_ASSERT (file ()->is_open ());

        // Build the initial segment address table.
        storage_.update_master_pointers (0);

        trailer::validate (*this, size_.footer_pos ());
        this->protect (address{sizeof (header)}, address{size_.logical_size ()});

        header_ = storage_.address_to_pointer (typed_address<header>::null ());
        sync_name_ = database::build_sync_name (*header_);

        // Put a shared-read lock on the lock_block strcut in the file. We're not going to modify
        // these bytes.
        range_lock_ =
            get_vacuum_range_lock (this->file (), file::file_handle::lock_kind::shared_read);
        lock_ = std::unique_lock<file::range_lock> (range_lock_);
    }